

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

Node * node_new_quantifier(int lower,int upper,int by_number)

{
  Node *node;
  int by_number_local;
  int upper_local;
  int lower_local;
  
  _upper_local = node_new();
  if (_upper_local == (Node *)0x0) {
    _upper_local = (Node *)0x0;
  }
  else {
    (_upper_local->u).base.node_type = ND_QUANT;
    (_upper_local->u).quant.lower = lower;
    (_upper_local->u).quant.upper = upper;
    (_upper_local->u).str.flag = 1;
    (_upper_local->u).cclass.bs[4] = 0;
    (_upper_local->u).quant.head_exact = (_Node *)0x0;
    (_upper_local->u).quant.next_head_exact = (_Node *)0x0;
    (_upper_local->u).quant.include_referred = 0;
    (_upper_local->u).str.capacity = 0;
    if (by_number != 0) {
      (_upper_local->u).base.status = (_upper_local->u).base.status | 0x4000;
    }
  }
  return _upper_local;
}

Assistant:

static Node*
node_new_quantifier(int lower, int upper, int by_number)
{
  Node* node = node_new();
  CHECK_NULL_RETURN(node);

  ND_SET_TYPE(node, ND_QUANT);
  QUANT_(node)->lower            = lower;
  QUANT_(node)->upper            = upper;
  QUANT_(node)->greedy           = 1;
  QUANT_(node)->emptiness        = BODY_IS_NOT_EMPTY;
  QUANT_(node)->head_exact       = NULL_NODE;
  QUANT_(node)->next_head_exact  = NULL_NODE;
  QUANT_(node)->include_referred = 0;
  QUANT_(node)->empty_status_mem = 0;
  if (by_number != 0)
    ND_STATUS_ADD(node, BY_NUMBER);

  return node;
}